

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_p.h
# Opt level: O2

bool __thiscall
QSharedMemoryPrivate::tryLocker
          (QSharedMemoryPrivate *this,QSharedMemoryLocker *locker,QString *function)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = QSharedMemoryLocker::lock(locker);
  if (!bVar4) {
    QSharedMemory::tr((QString *)&local_60,"%1: unable to lock",(char *)0x0,-1);
    QString::arg<QString,_true>((QString *)&local_48,(QString *)&local_60,function,0,(QChar)0x20);
    pDVar2 = (this->errorString).d.d;
    pcVar3 = (this->errorString).d.ptr;
    (this->errorString).d.d = local_48.d;
    (this->errorString).d.ptr = local_48.ptr;
    qVar1 = (this->errorString).d.size;
    (this->errorString).d.size = local_48.size;
    local_48.d = pDVar2;
    local_48.ptr = pcVar3;
    local_48.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    this->error = LockError;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool tryLocker(QSharedMemoryLocker *locker, const QString &function) {
        if (!locker->lock()) {
            errorString = QSharedMemory::tr("%1: unable to lock").arg(function);
            error = QSharedMemory::LockError;
            return false;
        }
        return true;
    }